

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request_queue_impl_qwqr.cpp
# Opt level: O2

void * foxxll::request_queue_impl_qwqr::worker(void *arg)

{
  _List_node_base *this;
  _List_node_base *this_00;
  Semaphore *this_01;
  _List_node_base *p_Var1;
  bool bVar2;
  value_type vVar3;
  __pid_t _Var4;
  long *plVar5;
  undefined4 extraout_var;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  int iVar6;
  request_ptr req;
  unique_lock<std::mutex> write_lock;
  mutex_type *pmVar7;
  
  this_01 = (Semaphore *)((long)arg + 0xf0);
  this = (_List_node_base *)((long)arg + 0x70);
  this_00 = (_List_node_base *)((long)arg + 0x58);
  tlx::Semaphore::wait(this_01,(void *)0x1);
  do {
    pmVar7 = (mutex_type *)((long)arg + 8);
    std::unique_lock<std::mutex>::unique_lock(&write_lock,(mutex_type *)((long)arg + 8));
    iVar6 = (int)pmVar7;
    p_Var1 = (((_List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                *)&this_00->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    bVar2 = p_Var1 != this_00;
    if (p_Var1 == this_00) {
      std::unique_lock<std::mutex>::unlock(&write_lock);
      tlx::Semaphore::signal(this_01,iVar6,__handler);
    }
    else {
      req.ptr_ = (request *)p_Var1[1]._M_next;
      if (req.ptr_ != (request *)0x0) {
        LOCK();
        ((req.ptr_)->super_reference_counter).reference_count_.super___atomic_base<unsigned_long>.
        _M_i = (__int_type)
               ((long)&((_List_node_base *)
                       ((req.ptr_)->super_reference_counter).reference_count_.
                       super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
        UNLOCK();
      }
      std::__cxx11::
      list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
      ::pop_front((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                   *)this_00);
      std::unique_lock<std::mutex>::unlock(&write_lock);
      plVar5 = (long *)__dynamic_cast(req.ptr_,&request::typeinfo,&serving_request::typeinfo,0);
      (**(code **)(*plVar5 + 0x58))(plVar5);
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(&req);
    }
    std::unique_lock<std::mutex>::~unique_lock(&write_lock);
    while( true ) {
      vVar3 = shared_state<foxxll::request_queue_impl_worker::thread_state>::operator()
                        ((shared_state<foxxll::request_queue_impl_worker::thread_state> *)
                         ((long)arg + 0x88));
      if (vVar3 == TERMINATING) {
        iVar6 = 1;
        _Var4 = tlx::Semaphore::wait(this_01,(void *)0x1);
        if (CONCAT44(extraout_var,_Var4) == 0) {
          write_lock._M_device._0_4_ = 3;
          shared_state<foxxll::request_queue_impl_worker::thread_state>::set_to
                    ((shared_state<foxxll::request_queue_impl_worker::thread_state> *)
                     ((long)arg + 0x88),(value_type *)&write_lock);
          return (void *)0x0;
        }
        tlx::Semaphore::signal(this_01,iVar6,__handler_00);
      }
      tlx::Semaphore::wait(this_01,(void *)0x1);
      if (bVar2) break;
      pmVar7 = (mutex_type *)((long)arg + 0x30);
      std::unique_lock<std::mutex>::unique_lock(&write_lock,(mutex_type *)((long)arg + 0x30));
      iVar6 = (int)pmVar7;
      p_Var1 = (((_List_base<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                  *)&this->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var1 == this) {
        std::unique_lock<std::mutex>::unlock(&write_lock);
        tlx::Semaphore::signal(this_01,iVar6,__handler_01);
      }
      else {
        req.ptr_ = (request *)p_Var1[1]._M_next;
        if (req.ptr_ != (request *)0x0) {
          LOCK();
          ((req.ptr_)->super_reference_counter).reference_count_.super___atomic_base<unsigned_long>.
          _M_i = (__int_type)
                 ((long)&((_List_node_base *)
                         ((req.ptr_)->super_reference_counter).reference_count_.
                         super___atomic_base<unsigned_long>._M_i)->_M_next + 1);
          UNLOCK();
        }
        std::__cxx11::
        list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
        ::pop_front((list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
                     *)this);
        std::unique_lock<std::mutex>::unlock(&write_lock);
        plVar5 = (long *)__dynamic_cast(req.ptr_,&request::typeinfo,&serving_request::typeinfo,0);
        (**(code **)(*plVar5 + 0x58))(plVar5);
        tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference(&req);
      }
      std::unique_lock<std::mutex>::~unique_lock(&write_lock);
      bVar2 = true;
    }
  } while( true );
}

Assistant:

void* request_queue_impl_qwqr::worker(void* arg)
{
    self* pthis = static_cast<self*>(arg);

    bool write_phase = true;
    for ( ; ; )
    {
        pthis->sem_.wait();

        if (write_phase)
        {
            std::unique_lock<std::mutex> write_lock(pthis->write_mutex_);
            if (!pthis->write_queue_.empty())
            {
                request_ptr req = pthis->write_queue_.front();
                pthis->write_queue_.pop_front();

                write_lock.unlock();

                //assert(req->get_reference_count()) > 1);
                dynamic_cast<serving_request*>(req.get())->serve();
            }
            else
            {
                write_lock.unlock();

                pthis->sem_.signal();

                if (pthis->priority_op_ == WRITE)
                    write_phase = false;
            }

            if (pthis->priority_op_ == NONE || pthis->priority_op_ == READ)
                write_phase = false;
        }
        else
        {
            std::unique_lock<std::mutex> read_lock(pthis->read_mutex_);

            if (!pthis->read_queue_.empty())
            {
                request_ptr req = pthis->read_queue_.front();
                pthis->read_queue_.pop_front();

                read_lock.unlock();

                TLX_LOG << "queue: before serve request has "
                        << req->reference_count() << " references ";
                //assert(req->get_reference_count() > 1);
                dynamic_cast<serving_request*>(req.get())->serve();
                TLX_LOG << "queue: after serve request has "
                        << req->reference_count() << " references ";
            }
            else
            {
                read_lock.unlock();

                pthis->sem_.signal();

                if (pthis->priority_op_ == READ)
                    write_phase = true;
            }

            if (pthis->priority_op_ == NONE || pthis->priority_op_ == WRITE)
                write_phase = true;
        }

        // terminate if it has been requested and queues are empty
        if (pthis->thread_state_() == TERMINATING) {
            if (pthis->sem_.wait() == 0)
                break;
            else
                pthis->sem_.signal();
        }
    }

    pthis->thread_state_.set_to(TERMINATED);

#if FOXXLL_MSVC >= 1700 && FOXXLL_MSVC <= 1800
    // Workaround for deadlock bug in Visual C++ Runtime 2012 and 2013, see
    // request_queue_impl_worker.cpp. -tb
    ExitThread(nullptr);
#else
    return nullptr;
#endif
}